

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to16.h
# Opt level: O0

void ncnn::im2col_sgemm_pack4to16_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m512 _val0_1;
  __m512 _w0_1;
  int j_1;
  __m512 _sum0_1;
  int nn_1;
  float *kptr_1;
  float *tmpptr_3;
  __m512 _valf;
  __m512 _vale;
  __m512 _vald;
  __m512 _valc;
  __m512 _valb;
  __m512 _vala;
  __m512 _val9;
  __m512 _val8;
  __m512 _val7;
  __m512 _val6;
  __m512 _val5;
  __m512 _val4;
  __m512 _val3;
  __m512 _val2;
  __m512 _val1;
  __m512 _val0;
  __m512 _w0;
  int j;
  __m512 _sumf;
  __m512 _sume;
  __m512 _sumd;
  __m512 _sumc;
  __m512 _sumb;
  __m512 _suma;
  __m512 _sum9;
  __m512 _sum8;
  __m512 _sum7;
  __m512 _sum6;
  __m512 _sum5;
  __m512 _sum4;
  __m512 _sum3;
  __m512 _sum2;
  __m512 _sum1;
  __m512 _sum0;
  int nn;
  float *kptr;
  float *tmpptr_2;
  int i_2;
  float *biasptr;
  float zeros [16];
  float *outptr0;
  int p;
  __m128 _val;
  int k_1;
  float *img0_1;
  int q_1;
  float *tmpptr_1;
  int i_1;
  __m128 tmp0_3;
  __m128 tmp1_3;
  __m128 tmp2_3;
  __m128 tmp3_3;
  __m128 tmp0_2;
  __m128 tmp1_2;
  __m128 tmp2_2;
  __m128 tmp3_2;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _rf;
  __m128 _re;
  __m128 _rd;
  __m128 _rc;
  __m128 _rb;
  __m128 _ra;
  __m128 _r9;
  __m128 _r8;
  __m128 _r7;
  __m128 _r6;
  __m128 _r5;
  __m128 _r4;
  __m128 _r3;
  __m128 _r2;
  __m128 _r1;
  __m128 _r0;
  int k;
  float *img0;
  int q;
  float *tmpptr;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat tmp;
  float *bias;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_8;
  Mat *m_6;
  Mat *m_3;
  Mat *m_1;
  undefined8 in_stack_ffffffffffffbf58;
  int _elempack;
  size_t in_stack_ffffffffffffbf60;
  undefined8 in_stack_ffffffffffffbf68;
  int _c;
  undefined8 in_stack_ffffffffffffbf70;
  int _w;
  Mat *in_stack_ffffffffffffbf78;
  Allocator *in_stack_ffffffffffffbfd8;
  undefined1 (*local_4000) [64];
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 local_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 local_3f30;
  undefined8 uStack_3f28;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 local_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 local_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ee0;
  undefined8 uStack_3ed8;
  undefined8 local_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 local_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 local_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 local_3e70;
  undefined8 uStack_3e68;
  undefined8 local_3e60;
  undefined8 uStack_3e58;
  undefined8 local_3e50;
  undefined8 uStack_3e48;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 local_3e30;
  undefined8 uStack_3e28;
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 local_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 local_3df0;
  undefined8 uStack_3de8;
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 local_3dd0;
  undefined8 uStack_3dc8;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 local_3db0;
  undefined8 uStack_3da8;
  undefined8 local_3da0;
  undefined8 uStack_3d98;
  undefined8 local_3d90;
  undefined8 uStack_3d88;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 local_3d70;
  undefined8 uStack_3d68;
  int local_3b44;
  undefined1 local_3b40 [64];
  undefined8 local_3ae0;
  undefined8 local_3ad8;
  undefined8 local_3ad0;
  undefined4 local_3ac8;
  long local_3ac0;
  undefined4 local_3ab8;
  undefined4 local_3ab4;
  undefined4 local_3ab0;
  undefined4 local_3aac;
  undefined4 local_3aa8;
  undefined8 local_3aa0;
  undefined1 (*local_3a98) [64];
  undefined8 local_3a90;
  undefined8 local_3a88;
  undefined8 local_3a80;
  undefined4 local_3a78;
  long *local_3a70;
  undefined4 local_3a68;
  undefined4 local_3a64;
  undefined4 local_3a60;
  undefined4 local_3a5c;
  undefined4 local_3a58;
  undefined8 local_3a50;
  uint *local_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 uStack_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 uStack_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 uStack_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 uStack_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 uStack_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 uStack_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 uStack_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 uStack_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 uStack_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 uStack_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 uStack_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 uStack_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 uStack_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 uStack_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 uStack_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 uStack_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 uStack_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  int local_35c4;
  undefined1 local_35c0 [64];
  undefined1 local_3580 [64];
  undefined1 local_3540 [64];
  undefined1 local_3500 [64];
  undefined1 local_34c0 [64];
  undefined1 local_3480 [64];
  undefined1 local_3440 [64];
  undefined1 local_3400 [64];
  undefined1 local_33c0 [64];
  undefined1 local_3380 [64];
  undefined1 local_3340 [64];
  undefined1 local_3300 [64];
  undefined1 local_32c0 [64];
  undefined1 local_3280 [64];
  undefined1 local_3240 [64];
  undefined1 local_3200 [64];
  int local_31a4;
  undefined8 local_31a0;
  undefined8 local_3198;
  undefined8 local_3190;
  undefined4 local_3188;
  long local_3180;
  undefined4 local_3178;
  undefined4 local_3174;
  undefined4 local_3170;
  undefined4 local_316c;
  undefined4 local_3168;
  undefined8 local_3160;
  undefined1 (*local_3158) [64];
  undefined8 local_3150;
  undefined8 local_3148;
  undefined8 local_3140;
  undefined4 local_3138;
  long *local_3130;
  undefined4 local_3128;
  undefined4 local_3124;
  undefined4 local_3120;
  undefined4 local_311c;
  undefined4 local_3118;
  undefined8 local_3110;
  uint *local_3108;
  int local_30fc;
  undefined1 (*local_30f8) [64];
  undefined1 local_30f0 [72];
  undefined8 local_30a8;
  undefined8 local_30a0;
  undefined8 local_3098;
  undefined4 local_3090;
  long local_3088;
  undefined4 local_3080;
  undefined4 local_307c;
  undefined4 local_3078;
  undefined4 local_3074;
  undefined4 local_3070;
  undefined8 local_3068;
  undefined8 *local_3060;
  int local_3054;
  undefined8 local_3050;
  undefined8 uStack_3048;
  int local_3034;
  undefined8 local_3030;
  undefined8 local_3028;
  undefined8 local_3020;
  undefined4 local_3018;
  long local_3010;
  undefined4 local_3008;
  undefined4 local_3004;
  undefined4 local_3000;
  undefined4 local_2ffc;
  undefined4 local_2ff8;
  undefined8 local_2ff0;
  undefined8 *local_2fe8;
  int local_2fdc;
  undefined8 local_2fd8;
  undefined8 local_2fd0;
  undefined8 local_2fc8;
  undefined4 local_2fc0;
  long *local_2fb8;
  undefined4 local_2fb0;
  undefined4 local_2fac;
  undefined4 local_2fa8;
  undefined4 local_2fa4;
  undefined4 local_2fa0;
  undefined8 local_2f98;
  undefined8 *local_2f90;
  int local_2f84;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 local_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 local_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 local_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 local_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 local_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 local_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 local_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 local_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 local_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 local_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 local_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 local_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 local_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 local_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 local_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 local_2d90;
  undefined8 uStack_2d88;
  int local_2d74;
  undefined8 local_2d70;
  undefined8 local_2d68;
  undefined8 local_2d60;
  undefined4 local_2d58;
  long local_2d50;
  undefined4 local_2d48;
  undefined4 local_2d44;
  undefined4 local_2d40;
  undefined4 local_2d3c;
  undefined4 local_2d38;
  undefined8 local_2d30;
  undefined1 (*local_2d28) [16];
  int local_2d1c;
  undefined8 local_2d18;
  undefined8 local_2d10;
  undefined8 local_2d08;
  undefined4 local_2d00;
  long *local_2cf8;
  undefined4 local_2cf0;
  undefined4 local_2cec;
  undefined4 local_2ce8;
  undefined4 local_2ce4;
  undefined4 local_2ce0;
  undefined8 local_2cd8;
  undefined8 *local_2cd0;
  int local_2cc4;
  int local_2cc0;
  int local_2cbc;
  int local_2cb8;
  void *local_2ca8;
  int *local_2ca0;
  long local_2c98;
  undefined4 local_2c90;
  long *local_2c88;
  undefined4 local_2c80;
  int local_2c7c;
  int local_2c78;
  undefined4 local_2c74;
  undefined4 local_2c70;
  long local_2c68;
  long local_2c60;
  int local_2c58;
  int local_2c54;
  int local_2c50;
  int local_2c4c;
  long *local_2c38;
  long *local_2c30;
  long *local_2c28;
  void **local_2c20;
  undefined8 *local_2c18;
  undefined8 *local_2c08;
  undefined8 *local_2bf8;
  undefined8 *local_2be8;
  undefined8 *local_2bd8;
  undefined8 *local_2bc8;
  undefined8 *local_2bb8;
  undefined8 *local_2ba8;
  undefined8 *local_2b98;
  void **local_2b88;
  int local_2b68;
  undefined4 local_2b64;
  void **local_2b60;
  undefined8 *local_2b40;
  undefined8 *local_2b20;
  undefined8 *local_2b00;
  undefined8 *local_2ae0;
  undefined8 *local_2ac0;
  undefined8 *local_2aa0;
  undefined8 *local_2a80;
  undefined8 *local_2a60;
  undefined8 *local_2a40;
  undefined1 local_2a35;
  int local_2a34;
  void **local_2a30;
  undefined8 *local_2a28;
  undefined1 local_2a05;
  int local_2a04;
  void **local_2a00;
  undefined8 *local_29f8;
  undefined1 local_29d5;
  int local_29d4;
  undefined8 *local_29c8;
  undefined1 local_29a5;
  int local_29a4;
  void **local_29a0;
  undefined8 *local_2998;
  undefined1 local_2975;
  int local_2974;
  void **local_2970;
  undefined8 *local_2968;
  undefined8 *local_2948;
  undefined8 *local_2940;
  undefined8 *local_2938;
  undefined8 *local_2930;
  undefined8 *local_2928;
  undefined8 *local_2920;
  undefined8 *local_2918;
  undefined8 *local_2910;
  undefined8 *local_2908;
  undefined1 local_28f5;
  int local_28f4;
  undefined8 *local_28e8;
  undefined1 local_28c5;
  int local_28c4;
  undefined8 *local_28b8;
  undefined1 local_2895;
  int local_2894;
  undefined8 *local_2888;
  undefined1 local_2865;
  int local_2864;
  undefined8 *local_2858;
  void *local_2760;
  undefined1 (*local_2750) [64];
  undefined1 (*local_2748) [64];
  undefined1 local_2740 [64];
  uint local_26c4;
  undefined1 local_26c0 [64];
  uint local_2644;
  undefined1 local_2640 [64];
  uint local_25c4;
  undefined1 local_25c0 [64];
  uint local_2544;
  undefined1 local_2540 [64];
  uint local_24c4;
  undefined1 local_24c0 [64];
  uint local_2444;
  undefined1 local_2440 [64];
  uint local_23c4;
  undefined1 local_23c0 [64];
  uint local_2344;
  undefined1 local_2340 [64];
  uint local_22c4;
  undefined1 local_22c0 [64];
  uint local_2244;
  undefined1 local_2240 [64];
  uint local_21c4;
  undefined1 local_21c0 [64];
  uint local_2144;
  undefined1 local_2140 [64];
  uint local_20c4;
  undefined1 local_20c0 [64];
  uint local_2044;
  undefined1 local_2040 [64];
  uint local_1fc4;
  undefined1 local_1fc0 [64];
  uint local_1f44;
  undefined1 local_1f40 [64];
  uint local_1ec4;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 uStack_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 uStack_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 uStack_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 uStack_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 uStack_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined1 (*local_11d0) [64];
  undefined1 (*local_11c8) [64];
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 *local_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 *local_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 *local_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 *local_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 *local_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 *local_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 *local_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 *local_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 *local_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 *local_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 *local_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 *local_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 *local_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 *local_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 *local_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 *local_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 *local_980;
  undefined8 *local_978;
  undefined1 (*local_970) [16];
  undefined1 (*local_968) [16];
  undefined1 (*local_960) [16];
  undefined1 (*local_958) [16];
  undefined1 (*local_950) [16];
  undefined1 (*local_948) [16];
  undefined1 (*local_940) [16];
  undefined1 (*local_938) [16];
  undefined1 (*local_930) [16];
  undefined1 (*local_928) [16];
  undefined1 (*local_920) [16];
  undefined1 (*local_918) [16];
  undefined1 (*local_910) [16];
  undefined1 (*local_908) [16];
  undefined1 (*local_900) [16];
  undefined1 (*local_8f8) [16];
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 *local_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 *local_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 *local_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 *local_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 *local_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 *local_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 *local_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 *local_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 *local_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 *local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 *local_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 *local_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 *local_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 *local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 *local_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 *local_2e0;
  long local_2d8;
  undefined4 local_2cc;
  long local_2c8;
  long local_2c0;
  undefined4 local_2b4;
  int local_2b0;
  int local_2ac;
  undefined8 *local_2a8;
  long local_2a0;
  undefined4 local_294;
  long local_290;
  long local_288;
  undefined4 local_27c;
  int local_278;
  int local_274;
  undefined8 *local_270;
  long local_268;
  undefined4 local_25c;
  long local_258;
  undefined1 (*local_250) [64];
  undefined4 local_244;
  int local_240;
  int local_23c;
  undefined8 *local_238;
  long local_230;
  undefined4 local_224;
  long local_220;
  undefined1 (*local_218) [64];
  undefined4 local_20c;
  int local_208;
  int local_204;
  undefined8 *local_200;
  long *local_1f8;
  undefined4 local_1ec;
  long local_1e8;
  undefined8 *local_1e0;
  undefined4 local_1d4;
  int local_1d0;
  int local_1cc;
  undefined8 *local_1c8;
  long *local_1c0;
  undefined4 local_1b4;
  long local_1b0;
  undefined8 *local_1a8;
  undefined4 local_19c;
  int local_198;
  int local_194;
  undefined8 *local_190;
  long local_188;
  undefined4 local_17c;
  long local_178;
  undefined8 *local_170;
  undefined4 local_164;
  int local_160;
  int local_15c;
  undefined8 *local_158;
  long *local_150;
  undefined4 local_144;
  long local_140;
  uint *local_138;
  undefined4 local_12c;
  int local_128;
  int local_124;
  undefined8 *local_120;
  long *local_118;
  undefined4 local_10c;
  long local_108;
  uint *local_100;
  undefined4 local_f4;
  int local_f0;
  int local_ec;
  undefined8 *local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  
  local_2c4c = *(int *)((long)in_RDI + 0x2c);
  local_2c50 = (int)in_RDI[6];
  local_2c54 = (int)in_RDI[7];
  local_2c58 = (int)in_RSI[7];
  local_2c60 = *in_RCX;
  local_2c20 = &local_2ca8;
  local_2ca8 = (void *)0x0;
  local_2ca0 = (int *)0x0;
  local_2c98 = 0;
  local_2c90 = 0;
  local_2c88 = (long *)0x0;
  local_2c80 = 0;
  local_2c7c = 0;
  local_2c78 = 0;
  local_2c74 = 0;
  local_2c70 = 0;
  local_2c68 = 0;
  _elempack = (int)((ulong)in_stack_ffffffffffffbf58 >> 0x20);
  _c = (int)((ulong)in_stack_ffffffffffffbf68 >> 0x20);
  _w = (int)((ulong)in_stack_ffffffffffffbf70 >> 0x20);
  local_2c38 = in_RDX;
  local_2c30 = in_RSI;
  local_2c28 = in_RDI;
  if (local_2c4c < 0x10) {
    Mat::create(in_stack_ffffffffffffbf78,_w,(int)in_stack_ffffffffffffbf70,_c,
                in_stack_ffffffffffffbf60,_elempack,in_stack_ffffffffffffbfd8);
  }
  else {
    Mat::create(in_stack_ffffffffffffbf78,_w,(int)in_stack_ffffffffffffbf70,_c,
                in_stack_ffffffffffffbf60,_elempack,in_stack_ffffffffffffbfd8);
  }
  local_2cb8 = local_2c4c >> 4;
  for (local_2cc0 = 0; local_2cc0 < local_2cb8; local_2cc0 = local_2cc0 + 1) {
    local_2cc4 = local_2cc0 * 0x10;
    local_2974 = local_2cc4 / 0x10;
    local_2968 = &local_2d18;
    local_2970 = &local_2ca8;
    local_1e0 = (undefined8 *)((long)local_2ca8 + local_2c68 * local_2974 * local_2c98);
    local_1c8 = &local_2d18;
    local_98 = (long)local_2c7c * (long)local_2c78 * local_2c98;
    local_2928 = &local_2d18;
    local_2c18 = &local_2d18;
    local_2cf8 = local_2c88;
    local_9c = 0x10;
    local_1cc = local_2c7c;
    local_1d0 = local_2c78;
    local_1d4 = local_2c74;
    local_1e8 = local_2c98;
    local_1ec = local_2c90;
    local_1f8 = local_2c88;
    local_2975 = 1;
    local_2d18 = 0;
    local_2d08 = 0;
    local_2d00 = 0;
    local_2cf0 = 0;
    local_2cec = 0;
    local_2ce8 = 0;
    local_2ce4 = 0;
    local_2ce0 = 0;
    local_2cd8 = 0;
    local_2d10 = 0;
    local_2cd0 = local_1e0;
    for (local_2d1c = 0; local_2d1c < local_2c54; local_2d1c = local_2d1c + 1) {
      local_2858 = &local_2d70;
      local_2ac = *(int *)((long)local_2c28 + 0x2c);
      local_2b0 = (int)local_2c28[6];
      local_2b4 = *(undefined4 *)((long)local_2c28 + 0x34);
      local_2c0 = *local_2c28 + local_2c28[8] * (long)local_2d1c * local_2c28[2];
      local_2c8 = local_2c28[2];
      local_2cc = (undefined4)local_2c28[3];
      local_2d8 = local_2c28[4];
      local_2a8 = &local_2d70;
      local_58 = (long)local_2ac * (long)local_2b0 * local_2c8;
      local_2908 = &local_2d70;
      local_2d28 = (undefined1 (*) [16])(local_2c0 + (long)(local_2cc0 << 6) * 4);
      local_2c08 = &local_2d70;
      local_5c = 0x10;
      local_2864 = local_2d1c;
      local_2865 = 1;
      local_2d70 = 0;
      local_2d60 = 0;
      local_2d58 = 0;
      local_2d48 = 0;
      local_2d44 = 0;
      local_2d40 = 0;
      local_2d3c = 0;
      local_2d38 = 0;
      local_2d30 = 0;
      local_2d68 = 0;
      for (local_2d74 = 0; local_2d74 < local_2c50; local_2d74 = local_2d74 + 1) {
        local_8f8 = local_2d28;
        local_800 = *(undefined8 *)*local_2d28;
        uStack_7f8 = *(undefined8 *)(*local_2d28 + 8);
        local_900 = local_2d28 + 1;
        local_810 = *(undefined8 *)*local_900;
        uStack_808 = *(undefined8 *)(local_2d28[1] + 8);
        local_908 = local_2d28 + 2;
        local_820 = *(undefined8 *)*local_908;
        uStack_818 = *(undefined8 *)(local_2d28[2] + 8);
        local_910 = local_2d28 + 3;
        local_830 = *(undefined8 *)*local_910;
        uStack_828 = *(undefined8 *)(local_2d28[3] + 8);
        local_918 = local_2d28 + 4;
        local_840 = *(undefined8 *)*local_918;
        uStack_838 = *(undefined8 *)(local_2d28[4] + 8);
        local_920 = local_2d28 + 5;
        local_850 = *(undefined8 *)*local_920;
        uStack_848 = *(undefined8 *)(local_2d28[5] + 8);
        local_928 = local_2d28 + 6;
        local_860 = *(undefined8 *)*local_928;
        uStack_858 = *(undefined8 *)(local_2d28[6] + 8);
        local_930 = local_2d28 + 7;
        local_870 = *(undefined8 *)*local_930;
        uStack_868 = *(undefined8 *)(local_2d28[7] + 8);
        local_938 = local_2d28 + 8;
        local_880 = *(undefined8 *)*local_938;
        uStack_878 = *(undefined8 *)(local_2d28[8] + 8);
        local_940 = local_2d28 + 9;
        local_890 = *(undefined8 *)*local_940;
        uStack_888 = *(undefined8 *)(local_2d28[9] + 8);
        local_948 = local_2d28 + 10;
        local_8a0 = *(undefined8 *)*local_948;
        uStack_898 = *(undefined8 *)(local_2d28[10] + 8);
        local_950 = local_2d28 + 0xb;
        local_8b0 = *(undefined8 *)*local_950;
        uStack_8a8 = *(undefined8 *)(local_2d28[0xb] + 8);
        local_958 = local_2d28 + 0xc;
        local_8c0 = *(undefined8 *)*local_958;
        uStack_8b8 = *(undefined8 *)(local_2d28[0xc] + 8);
        local_960 = local_2d28 + 0xd;
        local_8d0 = *(undefined8 *)*local_960;
        uStack_8c8 = *(undefined8 *)(local_2d28[0xd] + 8);
        local_968 = local_2d28 + 0xe;
        local_8e0 = *(undefined8 *)*local_968;
        uStack_8d8 = *(undefined8 *)(local_2d28[0xe] + 8);
        local_970 = local_2d28 + 0xf;
        local_8f0 = *(undefined8 *)*local_970;
        uStack_8e8 = *(undefined8 *)(local_2d28[0xf] + 8);
        auVar4 = vunpcklps_avx(*local_2d28,*local_900);
        local_3d70 = auVar4._0_8_;
        local_2ec0 = local_3d70;
        uStack_3d68 = auVar4._8_8_;
        uStack_2eb8 = uStack_3d68;
        auVar5 = vunpcklps_avx(*local_908,*local_910);
        local_3d80 = auVar5._0_8_;
        local_2ea0 = local_3d80;
        uStack_3d78 = auVar5._8_8_;
        uStack_2e98 = uStack_3d78;
        auVar1 = vunpckhps_avx(*local_2d28,*local_900);
        local_3d90 = auVar1._0_8_;
        local_2eb0 = local_3d90;
        uStack_3d88 = auVar1._8_8_;
        uStack_2ea8 = uStack_3d88;
        auVar2 = vunpckhps_avx(*local_908,*local_910);
        local_3da0 = auVar2._0_8_;
        local_2e90 = local_3da0;
        uStack_3d98 = auVar2._8_8_;
        uStack_2e88 = uStack_3d98;
        local_600 = local_3d70;
        uStack_5f8 = uStack_3d68;
        local_610 = local_3d80;
        uStack_608 = uStack_3d78;
        auVar3 = vunpcklpd_avx(auVar4,auVar5);
        local_3db0 = auVar3._0_8_;
        local_2d90 = local_3db0;
        uStack_3da8 = auVar3._8_8_;
        uStack_2d88 = uStack_3da8;
        local_500 = local_3d80;
        uStack_4f8 = uStack_3d78;
        local_510 = local_3d70;
        uStack_508 = uStack_3d68;
        auVar3 = vunpckhpd_avx(auVar4,auVar5);
        local_3dc0 = auVar3._0_8_;
        local_2da0 = local_3dc0;
        uStack_3db8 = auVar3._8_8_;
        uStack_2d98 = uStack_3db8;
        local_620 = local_3d90;
        uStack_618 = uStack_3d88;
        local_630 = local_3da0;
        uStack_628 = uStack_3d98;
        auVar3 = vunpcklpd_avx(auVar1,auVar2);
        local_3dd0 = auVar3._0_8_;
        local_2db0 = local_3dd0;
        uStack_3dc8 = auVar3._8_8_;
        uStack_2da8 = uStack_3dc8;
        local_520 = local_3da0;
        uStack_518 = uStack_3d98;
        local_530 = local_3d90;
        uStack_528 = uStack_3d88;
        auVar3 = vunpckhpd_avx(auVar1,auVar2);
        local_3de0 = auVar3._0_8_;
        local_2dc0 = local_3de0;
        uStack_3dd8 = auVar3._8_8_;
        uStack_2db8 = uStack_3dd8;
        auVar4 = vunpcklps_avx(*local_918,*local_920);
        local_3df0 = auVar4._0_8_;
        local_2f00 = local_3df0;
        uStack_3de8 = auVar4._8_8_;
        uStack_2ef8 = uStack_3de8;
        auVar5 = vunpcklps_avx(*local_928,*local_930);
        local_3e00 = auVar5._0_8_;
        local_2ee0 = local_3e00;
        uStack_3df8 = auVar5._8_8_;
        uStack_2ed8 = uStack_3df8;
        auVar1 = vunpckhps_avx(*local_918,*local_920);
        local_3e10 = auVar1._0_8_;
        local_2ef0 = local_3e10;
        uStack_3e08 = auVar1._8_8_;
        uStack_2ee8 = uStack_3e08;
        auVar2 = vunpckhps_avx(*local_928,*local_930);
        local_3e20 = auVar2._0_8_;
        local_2ed0 = local_3e20;
        uStack_3e18 = auVar2._8_8_;
        uStack_2ec8 = uStack_3e18;
        local_640 = local_3df0;
        uStack_638 = uStack_3de8;
        local_650 = local_3e00;
        uStack_648 = uStack_3df8;
        auVar3 = vunpcklpd_avx(auVar4,auVar5);
        local_3e30 = auVar3._0_8_;
        local_2dd0 = local_3e30;
        uStack_3e28 = auVar3._8_8_;
        uStack_2dc8 = uStack_3e28;
        local_540 = local_3e00;
        uStack_538 = uStack_3df8;
        local_550 = local_3df0;
        uStack_548 = uStack_3de8;
        auVar3 = vunpckhpd_avx(auVar4,auVar5);
        local_3e40 = auVar3._0_8_;
        local_2de0 = local_3e40;
        uStack_3e38 = auVar3._8_8_;
        uStack_2dd8 = uStack_3e38;
        local_660 = local_3e10;
        uStack_658 = uStack_3e08;
        local_670 = local_3e20;
        uStack_668 = uStack_3e18;
        auVar3 = vunpcklpd_avx(auVar1,auVar2);
        local_3e50 = auVar3._0_8_;
        local_2df0 = local_3e50;
        uStack_3e48 = auVar3._8_8_;
        uStack_2de8 = uStack_3e48;
        local_560 = local_3e20;
        uStack_558 = uStack_3e18;
        local_570 = local_3e10;
        uStack_568 = uStack_3e08;
        auVar3 = vunpckhpd_avx(auVar1,auVar2);
        local_3e60 = auVar3._0_8_;
        local_2e00 = local_3e60;
        uStack_3e58 = auVar3._8_8_;
        uStack_2df8 = uStack_3e58;
        auVar4 = vunpcklps_avx(*local_938,*local_940);
        local_3e70 = auVar4._0_8_;
        local_2f40 = local_3e70;
        uStack_3e68 = auVar4._8_8_;
        uStack_2f38 = uStack_3e68;
        auVar5 = vunpcklps_avx(*local_948,*local_950);
        local_3e80 = auVar5._0_8_;
        local_2f20 = local_3e80;
        uStack_3e78 = auVar5._8_8_;
        uStack_2f18 = uStack_3e78;
        auVar1 = vunpckhps_avx(*local_938,*local_940);
        local_3e90 = auVar1._0_8_;
        local_2f30 = local_3e90;
        uStack_3e88 = auVar1._8_8_;
        uStack_2f28 = uStack_3e88;
        auVar2 = vunpckhps_avx(*local_948,*local_950);
        local_3ea0 = auVar2._0_8_;
        local_2f10 = local_3ea0;
        uStack_3e98 = auVar2._8_8_;
        uStack_2f08 = uStack_3e98;
        local_680 = local_3e70;
        uStack_678 = uStack_3e68;
        local_690 = local_3e80;
        uStack_688 = uStack_3e78;
        auVar3 = vunpcklpd_avx(auVar4,auVar5);
        local_3eb0 = auVar3._0_8_;
        local_2e10 = local_3eb0;
        uStack_3ea8 = auVar3._8_8_;
        uStack_2e08 = uStack_3ea8;
        local_580 = local_3e80;
        uStack_578 = uStack_3e78;
        local_590 = local_3e70;
        uStack_588 = uStack_3e68;
        auVar3 = vunpckhpd_avx(auVar4,auVar5);
        local_3ec0 = auVar3._0_8_;
        local_2e20 = local_3ec0;
        uStack_3eb8 = auVar3._8_8_;
        uStack_2e18 = uStack_3eb8;
        local_6a0 = local_3e90;
        uStack_698 = uStack_3e88;
        local_6b0 = local_3ea0;
        uStack_6a8 = uStack_3e98;
        auVar3 = vunpcklpd_avx(auVar1,auVar2);
        local_3ed0 = auVar3._0_8_;
        local_2e30 = local_3ed0;
        uStack_3ec8 = auVar3._8_8_;
        uStack_2e28 = uStack_3ec8;
        local_5a0 = local_3ea0;
        uStack_598 = uStack_3e98;
        local_5b0 = local_3e90;
        uStack_5a8 = uStack_3e88;
        auVar3 = vunpckhpd_avx(auVar1,auVar2);
        local_3ee0 = auVar3._0_8_;
        local_2e40 = local_3ee0;
        uStack_3ed8 = auVar3._8_8_;
        uStack_2e38 = uStack_3ed8;
        auVar4 = vunpcklps_avx(*local_958,*local_960);
        local_3ef0 = auVar4._0_8_;
        local_2f80 = local_3ef0;
        uStack_3ee8 = auVar4._8_8_;
        uStack_2f78 = uStack_3ee8;
        auVar5 = vunpcklps_avx(*local_968,*local_970);
        local_3f00 = auVar5._0_8_;
        local_2f60 = local_3f00;
        uStack_3ef8 = auVar5._8_8_;
        uStack_2f58 = uStack_3ef8;
        auVar1 = vunpckhps_avx(*local_958,*local_960);
        local_3f10 = auVar1._0_8_;
        local_2f70 = local_3f10;
        uStack_3f08 = auVar1._8_8_;
        uStack_2f68 = uStack_3f08;
        auVar2 = vunpckhps_avx(*local_968,*local_970);
        local_3f20 = auVar2._0_8_;
        local_2f50 = local_3f20;
        uStack_3f18 = auVar2._8_8_;
        uStack_2f48 = uStack_3f18;
        local_6c0 = local_3ef0;
        uStack_6b8 = uStack_3ee8;
        local_6d0 = local_3f00;
        uStack_6c8 = uStack_3ef8;
        auVar3 = vunpcklpd_avx(auVar4,auVar5);
        local_3f30 = auVar3._0_8_;
        local_2e50 = local_3f30;
        uStack_3f28 = auVar3._8_8_;
        uStack_2e48 = uStack_3f28;
        local_5c0 = local_3f00;
        uStack_5b8 = uStack_3ef8;
        local_5d0 = local_3ef0;
        uStack_5c8 = uStack_3ee8;
        auVar3 = vunpckhpd_avx(auVar4,auVar5);
        local_3f40 = auVar3._0_8_;
        local_2e60 = local_3f40;
        uStack_3f38 = auVar3._8_8_;
        uStack_2e58 = uStack_3f38;
        local_6e0 = local_3f10;
        uStack_6d8 = uStack_3f08;
        local_6f0 = local_3f20;
        uStack_6e8 = uStack_3f18;
        auVar3 = vunpcklpd_avx(auVar1,auVar2);
        local_3f50 = auVar3._0_8_;
        local_2e70 = local_3f50;
        uStack_3f48 = auVar3._8_8_;
        uStack_2e68 = uStack_3f48;
        local_5e0 = local_3f20;
        uStack_5d8 = uStack_3f18;
        local_5f0 = local_3f10;
        uStack_5e8 = uStack_3f08;
        auVar3 = vunpckhpd_avx(auVar1,auVar2);
        local_3f60 = auVar3._0_8_;
        local_2e80 = local_3f60;
        uStack_3f58 = auVar3._8_8_;
        uStack_2e78 = uStack_3f58;
        local_2e0 = local_2cd0;
        local_2f0 = local_3db0;
        uStack_2e8 = uStack_3da8;
        *local_2cd0 = local_3db0;
        local_2cd0[1] = uStack_3da8;
        local_2f8 = local_2cd0 + 2;
        local_310 = local_3e30;
        uStack_308 = uStack_3e28;
        *local_2f8 = local_3e30;
        local_2cd0[3] = uStack_3e28;
        local_318 = local_2cd0 + 4;
        local_330 = local_3eb0;
        uStack_328 = uStack_3ea8;
        *local_318 = local_3eb0;
        local_2cd0[5] = uStack_3ea8;
        local_338 = local_2cd0 + 6;
        local_350 = local_3f30;
        uStack_348 = uStack_3f28;
        *local_338 = local_3f30;
        local_2cd0[7] = uStack_3f28;
        local_358 = local_2cd0 + 8;
        local_370 = local_3dc0;
        uStack_368 = uStack_3db8;
        *local_358 = local_3dc0;
        local_2cd0[9] = uStack_3db8;
        local_378 = local_2cd0 + 10;
        local_390 = local_3e40;
        uStack_388 = uStack_3e38;
        *local_378 = local_3e40;
        local_2cd0[0xb] = uStack_3e38;
        local_398 = local_2cd0 + 0xc;
        local_3b0 = local_3ec0;
        uStack_3a8 = uStack_3eb8;
        *local_398 = local_3ec0;
        local_2cd0[0xd] = uStack_3eb8;
        local_3b8 = local_2cd0 + 0xe;
        local_3d0 = local_3f40;
        uStack_3c8 = uStack_3f38;
        *local_3b8 = local_3f40;
        local_2cd0[0xf] = uStack_3f38;
        local_3d8 = local_2cd0 + 0x10;
        local_3f0 = local_3dd0;
        uStack_3e8 = uStack_3dc8;
        *local_3d8 = local_3dd0;
        local_2cd0[0x11] = uStack_3dc8;
        local_3f8 = local_2cd0 + 0x12;
        local_410 = local_3e50;
        uStack_408 = uStack_3e48;
        *local_3f8 = local_3e50;
        local_2cd0[0x13] = uStack_3e48;
        local_418 = local_2cd0 + 0x14;
        local_430 = local_3ed0;
        uStack_428 = uStack_3ec8;
        *local_418 = local_3ed0;
        local_2cd0[0x15] = uStack_3ec8;
        local_438 = local_2cd0 + 0x16;
        local_450 = local_3f50;
        uStack_448 = uStack_3f48;
        *local_438 = local_3f50;
        local_2cd0[0x17] = uStack_3f48;
        local_458 = local_2cd0 + 0x18;
        local_470 = local_3de0;
        uStack_468 = uStack_3dd8;
        *local_458 = local_3de0;
        local_2cd0[0x19] = uStack_3dd8;
        local_478 = local_2cd0 + 0x1a;
        local_490 = local_3e60;
        uStack_488 = uStack_3e58;
        *local_478 = local_3e60;
        local_2cd0[0x1b] = uStack_3e58;
        local_498 = local_2cd0 + 0x1c;
        local_4b0 = local_3ee0;
        uStack_4a8 = uStack_3ed8;
        *local_498 = local_3ee0;
        local_2cd0[0x1d] = uStack_3ed8;
        local_4b8 = local_2cd0 + 0x1e;
        local_4d0 = local_3f60;
        uStack_4c8 = uStack_3f58;
        *local_4b8 = local_3f60;
        local_2cd0[0x1f] = uStack_3f58;
        local_2d28 = (undefined1 (*) [16])(*local_2d28 + (long)(local_2c4c << 2) * 4);
        local_2cd0 = local_2cd0 + 0x20;
        local_7f0 = local_8f0;
        uStack_7e8 = uStack_8e8;
        local_7e0 = local_8e0;
        uStack_7d8 = uStack_8d8;
        local_7d0 = local_8d0;
        uStack_7c8 = uStack_8c8;
        local_7c0 = local_8c0;
        uStack_7b8 = uStack_8b8;
        local_7b0 = local_8b0;
        uStack_7a8 = uStack_8a8;
        local_7a0 = local_8a0;
        uStack_798 = uStack_898;
        local_790 = local_890;
        uStack_788 = uStack_888;
        local_780 = local_880;
        uStack_778 = uStack_878;
        local_770 = local_870;
        uStack_768 = uStack_868;
        local_760 = local_860;
        uStack_758 = uStack_858;
        local_750 = local_850;
        uStack_748 = uStack_848;
        local_740 = local_840;
        uStack_738 = uStack_838;
        local_730 = local_830;
        uStack_728 = uStack_828;
        local_720 = local_820;
        uStack_718 = uStack_818;
        local_710 = local_810;
        uStack_708 = uStack_808;
        local_700 = local_800;
        uStack_6f8 = uStack_7f8;
      }
      local_2a60 = local_2c08;
      local_2d50 = local_2d8;
    }
    local_2a40 = local_2c18;
  }
  local_2cbc = local_2cb8 * 0x10;
  for (local_2f84 = local_2cbc; local_2f84 < local_2c4c; local_2f84 = local_2f84 + 1) {
    local_29a4 = local_2f84 / 0x10 + local_2f84 % 0x10;
    local_2998 = &local_2fd8;
    local_29a0 = &local_2ca8;
    local_1a8 = (undefined8 *)((long)local_2ca8 + local_2c68 * local_29a4 * local_2c98);
    local_190 = &local_2fd8;
    local_a8 = (long)local_2c7c * (long)local_2c78 * local_2c98;
    local_2930 = &local_2fd8;
    local_2bf8 = &local_2fd8;
    local_2fb8 = local_2c88;
    local_ac = 0x10;
    local_194 = local_2c7c;
    local_198 = local_2c78;
    local_19c = local_2c74;
    local_1b0 = local_2c98;
    local_1b4 = local_2c90;
    local_1c0 = local_2c88;
    local_29a5 = 1;
    local_2fd8 = 0;
    local_2fc8 = 0;
    local_2fc0 = 0;
    local_2fb0 = 0;
    local_2fac = 0;
    local_2fa8 = 0;
    local_2fa4 = 0;
    local_2fa0 = 0;
    local_2f98 = 0;
    local_2fd0 = 0;
    local_2f90 = local_1a8;
    for (local_2fdc = 0; local_2fdc < local_2c54; local_2fdc = local_2fdc + 1) {
      local_2888 = &local_3030;
      local_274 = *(int *)((long)local_2c28 + 0x2c);
      local_278 = (int)local_2c28[6];
      local_27c = *(undefined4 *)((long)local_2c28 + 0x34);
      local_288 = *local_2c28 + local_2c28[8] * (long)local_2fdc * local_2c28[2];
      local_290 = local_2c28[2];
      local_294 = (undefined4)local_2c28[3];
      local_2a0 = local_2c28[4];
      local_270 = &local_3030;
      local_68 = (long)local_274 * (long)local_278 * local_290;
      local_2910 = &local_3030;
      local_2fe8 = (undefined8 *)(local_288 + (long)(local_2f84 << 2) * 4);
      local_2be8 = &local_3030;
      local_6c = 0x10;
      local_2894 = local_2fdc;
      local_2895 = 1;
      local_3030 = 0;
      local_3020 = 0;
      local_3018 = 0;
      local_3008 = 0;
      local_3004 = 0;
      local_3000 = 0;
      local_2ffc = 0;
      local_2ff8 = 0;
      local_2ff0 = 0;
      local_3028 = 0;
      for (local_3034 = 0; local_3034 < local_2c50; local_3034 = local_3034 + 1) {
        local_978 = local_2fe8;
        local_3050 = *local_2fe8;
        uStack_3048 = local_2fe8[1];
        local_4d8 = local_2f90;
        *local_2f90 = local_3050;
        local_2f90[1] = uStack_3048;
        local_2fe8 = (undefined8 *)((long)local_2fe8 + (long)(local_2c4c << 2) * 4);
        local_2f90 = local_2f90 + 2;
        local_4f0 = local_3050;
        uStack_4e8 = uStack_3048;
      }
      local_2aa0 = local_2be8;
      local_3010 = local_2a0;
    }
    local_2a80 = local_2bf8;
  }
  for (local_3054 = 0; local_3054 < local_2c58; local_3054 = local_3054 + 1) {
    local_29c8 = &local_30a8;
    local_15c = *(int *)((long)local_2c30 + 0x2c);
    local_160 = (int)local_2c30[6];
    local_164 = *(undefined4 *)((long)local_2c30 + 0x34);
    local_3060 = (undefined8 *)(*local_2c30 + local_2c30[8] * (long)local_3054 * local_2c30[2]);
    local_178 = local_2c30[2];
    local_17c = (undefined4)local_2c30[3];
    local_188 = local_2c30[4];
    local_158 = &local_30a8;
    local_b8 = (long)local_15c * (long)local_160 * local_178;
    local_2938 = &local_30a8;
    local_2bd8 = &local_30a8;
    local_bc = 0x10;
    local_29d4 = local_3054;
    local_29d5 = 1;
    local_30a8 = 0;
    local_3098 = 0;
    local_3090 = 0;
    local_3080 = 0;
    local_307c = 0;
    local_3078 = 0;
    local_3074 = 0;
    local_3070 = 0;
    local_3068 = 0;
    local_30a0 = 0;
    local_2ac0 = local_2bd8;
    local_170 = local_3060;
    local_3088 = local_188;
    memset(local_30f0,0,0x40);
    if (local_2c60 == 0) {
      local_4000 = (undefined1 (*) [64])local_30f0;
    }
    else {
      local_4000 = (undefined1 (*) [64])(local_2c60 + (long)(local_3054 << 4) * 4);
    }
    local_30f8 = local_4000;
    for (local_30fc = 0; local_30fc + 0xf < local_2c4c; local_30fc = local_30fc + 0x10) {
      local_2a04 = local_30fc / 0x10;
      local_29f8 = &local_3150;
      local_2a00 = &local_2ca8;
      local_138 = (uint *)((long)local_2ca8 + local_2c68 * local_2a04 * local_2c98);
      local_120 = &local_3150;
      local_c8 = (long)local_2c7c * (long)local_2c78 * local_2c98;
      local_2940 = &local_3150;
      local_2bc8 = &local_3150;
      local_3130 = local_2c88;
      local_cc = 0x10;
      local_124 = local_2c7c;
      local_128 = local_2c78;
      local_12c = local_2c74;
      local_140 = local_2c98;
      local_144 = local_2c90;
      local_150 = local_2c88;
      local_2a05 = 1;
      local_3150 = 0;
      local_3140 = 0;
      local_3138 = 0;
      local_3128 = 0;
      local_3124 = 0;
      local_3120 = 0;
      local_311c = 0;
      local_3118 = 0;
      local_3110 = 0;
      local_3148 = 0;
      local_28b8 = &local_31a0;
      local_23c = *(int *)((long)local_2c38 + 0x2c);
      local_240 = (int)local_2c38[6];
      local_244 = *(undefined4 *)((long)local_2c38 + 0x34);
      local_250 = (undefined1 (*) [64])
                  (*local_2c38 + local_2c38[8] * (long)local_3054 * local_2c38[2]);
      local_258 = local_2c38[2];
      local_25c = (undefined4)local_2c38[3];
      local_268 = local_2c38[4];
      local_238 = &local_31a0;
      local_78 = (long)local_23c * (long)local_240 * local_258;
      local_7c = 0x10;
      local_28c4 = local_3054;
      local_28c5 = 1;
      local_2918 = &local_31a0;
      local_2bb8 = &local_31a0;
      local_31a0 = 0;
      local_3190 = 0;
      local_3188 = 0;
      local_3178 = 0;
      local_3174 = 0;
      local_3170 = 0;
      local_316c = 0;
      local_3168 = 0;
      local_3160 = 0;
      local_3198 = 0;
      local_31a4 = local_2c54 * local_2c50 * 4;
      local_2748 = local_4000;
      local_3240 = *local_4000;
      local_35c0 = *local_4000;
      local_3580 = *local_4000;
      local_3540 = *local_4000;
      local_3500 = *local_4000;
      local_34c0 = *local_4000;
      local_3480 = *local_4000;
      local_3440 = *local_4000;
      local_3400 = *local_4000;
      local_33c0 = *local_4000;
      local_3380 = *local_4000;
      local_3340 = *local_4000;
      local_3300 = *local_4000;
      local_32c0 = *local_4000;
      local_3280 = *local_4000;
      local_3200 = *local_4000;
      local_35c4 = 0;
      local_3158 = local_250;
      local_3108 = local_138;
      while( true ) {
        if (local_31a4 <= local_35c4) break;
        local_11c8 = local_3158;
        local_3640 = *(undefined8 *)*local_3158;
        uStack_3638 = *(undefined8 *)(*local_3158 + 8);
        uStack_3630 = *(undefined8 *)(*local_3158 + 0x10);
        uStack_3628 = *(undefined8 *)(*local_3158 + 0x18);
        uStack_3620 = *(undefined8 *)(*local_3158 + 0x20);
        uStack_3618 = *(undefined8 *)(*local_3158 + 0x28);
        uStack_3610 = *(undefined8 *)(*local_3158 + 0x30);
        uStack_3608 = *(undefined8 *)(*local_3158 + 0x38);
        local_1ec4 = *local_3108;
        local_1f40 = vbroadcastss_avx512f(ZEXT416(local_1ec4));
        local_3680 = local_1f40._0_8_;
        uStack_3678 = local_1f40._8_8_;
        uStack_3670 = local_1f40._16_8_;
        uStack_3668 = local_1f40._24_8_;
        uStack_3660 = local_1f40._32_8_;
        uStack_3658 = local_1f40._40_8_;
        uStack_3650 = local_1f40._48_8_;
        uStack_3648 = local_1f40._56_8_;
        local_1f44 = local_3108[1];
        local_1fc0 = vbroadcastss_avx512f(ZEXT416(local_1f44));
        local_36c0 = local_1fc0._0_8_;
        uStack_36b8 = local_1fc0._8_8_;
        uStack_36b0 = local_1fc0._16_8_;
        uStack_36a8 = local_1fc0._24_8_;
        uStack_36a0 = local_1fc0._32_8_;
        uStack_3698 = local_1fc0._40_8_;
        uStack_3690 = local_1fc0._48_8_;
        uStack_3688 = local_1fc0._56_8_;
        local_1240 = local_1f40._0_8_;
        uStack_1238 = local_1f40._8_8_;
        uStack_1230 = local_1f40._16_8_;
        uStack_1228 = local_1f40._24_8_;
        uStack_1220 = local_1f40._32_8_;
        uStack_1218 = local_1f40._40_8_;
        uStack_1210 = local_1f40._48_8_;
        uStack_1208 = local_1f40._56_8_;
        local_12c0 = local_3200._0_8_;
        uStack_12b8 = local_3200._8_8_;
        uStack_12b0 = local_3200._16_8_;
        uStack_12a8 = local_3200._24_8_;
        uStack_12a0 = local_3200._32_8_;
        uStack_1298 = local_3200._40_8_;
        uStack_1290 = local_3200._48_8_;
        uStack_1288 = local_3200._56_8_;
        local_3200 = vfmadd213ps_avx512f(*local_3158,local_1f40,local_3200);
        local_1300 = local_1fc0._0_8_;
        uStack_12f8 = local_1fc0._8_8_;
        uStack_12f0 = local_1fc0._16_8_;
        uStack_12e8 = local_1fc0._24_8_;
        uStack_12e0 = local_1fc0._32_8_;
        uStack_12d8 = local_1fc0._40_8_;
        uStack_12d0 = local_1fc0._48_8_;
        uStack_12c8 = local_1fc0._56_8_;
        local_1380 = local_3240._0_8_;
        uStack_1378 = local_3240._8_8_;
        uStack_1370 = local_3240._16_8_;
        uStack_1368 = local_3240._24_8_;
        uStack_1360 = local_3240._32_8_;
        uStack_1358 = local_3240._40_8_;
        uStack_1350 = local_3240._48_8_;
        uStack_1348 = local_3240._56_8_;
        local_3240 = vfmadd213ps_avx512f(*local_3158,local_1fc0,local_3240);
        local_1fc4 = local_3108[2];
        local_2040 = vbroadcastss_avx512f(ZEXT416(local_1fc4));
        local_3700 = local_2040._0_8_;
        uStack_36f8 = local_2040._8_8_;
        uStack_36f0 = local_2040._16_8_;
        uStack_36e8 = local_2040._24_8_;
        uStack_36e0 = local_2040._32_8_;
        uStack_36d8 = local_2040._40_8_;
        uStack_36d0 = local_2040._48_8_;
        uStack_36c8 = local_2040._56_8_;
        local_2044 = local_3108[3];
        local_20c0 = vbroadcastss_avx512f(ZEXT416(local_2044));
        local_3740 = local_20c0._0_8_;
        uStack_3738 = local_20c0._8_8_;
        uStack_3730 = local_20c0._16_8_;
        uStack_3728 = local_20c0._24_8_;
        uStack_3720 = local_20c0._32_8_;
        uStack_3718 = local_20c0._40_8_;
        uStack_3710 = local_20c0._48_8_;
        uStack_3708 = local_20c0._56_8_;
        local_13c0 = local_2040._0_8_;
        uStack_13b8 = local_2040._8_8_;
        uStack_13b0 = local_2040._16_8_;
        uStack_13a8 = local_2040._24_8_;
        uStack_13a0 = local_2040._32_8_;
        uStack_1398 = local_2040._40_8_;
        uStack_1390 = local_2040._48_8_;
        uStack_1388 = local_2040._56_8_;
        local_1440 = local_3280._0_8_;
        uStack_1438 = local_3280._8_8_;
        uStack_1430 = local_3280._16_8_;
        uStack_1428 = local_3280._24_8_;
        uStack_1420 = local_3280._32_8_;
        uStack_1418 = local_3280._40_8_;
        uStack_1410 = local_3280._48_8_;
        uStack_1408 = local_3280._56_8_;
        local_3280 = vfmadd213ps_avx512f(*local_3158,local_2040,local_3280);
        local_1480 = local_20c0._0_8_;
        uStack_1478 = local_20c0._8_8_;
        uStack_1470 = local_20c0._16_8_;
        uStack_1468 = local_20c0._24_8_;
        uStack_1460 = local_20c0._32_8_;
        uStack_1458 = local_20c0._40_8_;
        uStack_1450 = local_20c0._48_8_;
        uStack_1448 = local_20c0._56_8_;
        local_1500 = local_32c0._0_8_;
        uStack_14f8 = local_32c0._8_8_;
        uStack_14f0 = local_32c0._16_8_;
        uStack_14e8 = local_32c0._24_8_;
        uStack_14e0 = local_32c0._32_8_;
        uStack_14d8 = local_32c0._40_8_;
        uStack_14d0 = local_32c0._48_8_;
        uStack_14c8 = local_32c0._56_8_;
        local_32c0 = vfmadd213ps_avx512f(*local_3158,local_20c0,local_32c0);
        local_20c4 = local_3108[4];
        local_2140 = vbroadcastss_avx512f(ZEXT416(local_20c4));
        local_3780 = local_2140._0_8_;
        uStack_3778 = local_2140._8_8_;
        uStack_3770 = local_2140._16_8_;
        uStack_3768 = local_2140._24_8_;
        uStack_3760 = local_2140._32_8_;
        uStack_3758 = local_2140._40_8_;
        uStack_3750 = local_2140._48_8_;
        uStack_3748 = local_2140._56_8_;
        local_2144 = local_3108[5];
        local_21c0 = vbroadcastss_avx512f(ZEXT416(local_2144));
        local_37c0 = local_21c0._0_8_;
        uStack_37b8 = local_21c0._8_8_;
        uStack_37b0 = local_21c0._16_8_;
        uStack_37a8 = local_21c0._24_8_;
        uStack_37a0 = local_21c0._32_8_;
        uStack_3798 = local_21c0._40_8_;
        uStack_3790 = local_21c0._48_8_;
        uStack_3788 = local_21c0._56_8_;
        local_1540 = local_2140._0_8_;
        uStack_1538 = local_2140._8_8_;
        uStack_1530 = local_2140._16_8_;
        uStack_1528 = local_2140._24_8_;
        uStack_1520 = local_2140._32_8_;
        uStack_1518 = local_2140._40_8_;
        uStack_1510 = local_2140._48_8_;
        uStack_1508 = local_2140._56_8_;
        local_15c0 = local_3300._0_8_;
        uStack_15b8 = local_3300._8_8_;
        uStack_15b0 = local_3300._16_8_;
        uStack_15a8 = local_3300._24_8_;
        uStack_15a0 = local_3300._32_8_;
        uStack_1598 = local_3300._40_8_;
        uStack_1590 = local_3300._48_8_;
        uStack_1588 = local_3300._56_8_;
        local_3300 = vfmadd213ps_avx512f(*local_3158,local_2140,local_3300);
        local_1600 = local_21c0._0_8_;
        uStack_15f8 = local_21c0._8_8_;
        uStack_15f0 = local_21c0._16_8_;
        uStack_15e8 = local_21c0._24_8_;
        uStack_15e0 = local_21c0._32_8_;
        uStack_15d8 = local_21c0._40_8_;
        uStack_15d0 = local_21c0._48_8_;
        uStack_15c8 = local_21c0._56_8_;
        local_1680 = local_3340._0_8_;
        uStack_1678 = local_3340._8_8_;
        uStack_1670 = local_3340._16_8_;
        uStack_1668 = local_3340._24_8_;
        uStack_1660 = local_3340._32_8_;
        uStack_1658 = local_3340._40_8_;
        uStack_1650 = local_3340._48_8_;
        uStack_1648 = local_3340._56_8_;
        local_3340 = vfmadd213ps_avx512f(*local_3158,local_21c0,local_3340);
        local_21c4 = local_3108[6];
        local_2240 = vbroadcastss_avx512f(ZEXT416(local_21c4));
        local_3800 = local_2240._0_8_;
        uStack_37f8 = local_2240._8_8_;
        uStack_37f0 = local_2240._16_8_;
        uStack_37e8 = local_2240._24_8_;
        uStack_37e0 = local_2240._32_8_;
        uStack_37d8 = local_2240._40_8_;
        uStack_37d0 = local_2240._48_8_;
        uStack_37c8 = local_2240._56_8_;
        local_2244 = local_3108[7];
        local_22c0 = vbroadcastss_avx512f(ZEXT416(local_2244));
        local_3840 = local_22c0._0_8_;
        uStack_3838 = local_22c0._8_8_;
        uStack_3830 = local_22c0._16_8_;
        uStack_3828 = local_22c0._24_8_;
        uStack_3820 = local_22c0._32_8_;
        uStack_3818 = local_22c0._40_8_;
        uStack_3810 = local_22c0._48_8_;
        uStack_3808 = local_22c0._56_8_;
        local_16c0 = local_2240._0_8_;
        uStack_16b8 = local_2240._8_8_;
        uStack_16b0 = local_2240._16_8_;
        uStack_16a8 = local_2240._24_8_;
        uStack_16a0 = local_2240._32_8_;
        uStack_1698 = local_2240._40_8_;
        uStack_1690 = local_2240._48_8_;
        uStack_1688 = local_2240._56_8_;
        local_1740 = local_3380._0_8_;
        uStack_1738 = local_3380._8_8_;
        uStack_1730 = local_3380._16_8_;
        uStack_1728 = local_3380._24_8_;
        uStack_1720 = local_3380._32_8_;
        uStack_1718 = local_3380._40_8_;
        uStack_1710 = local_3380._48_8_;
        uStack_1708 = local_3380._56_8_;
        local_3380 = vfmadd213ps_avx512f(*local_3158,local_2240,local_3380);
        local_1780 = local_22c0._0_8_;
        uStack_1778 = local_22c0._8_8_;
        uStack_1770 = local_22c0._16_8_;
        uStack_1768 = local_22c0._24_8_;
        uStack_1760 = local_22c0._32_8_;
        uStack_1758 = local_22c0._40_8_;
        uStack_1750 = local_22c0._48_8_;
        uStack_1748 = local_22c0._56_8_;
        local_1800 = local_33c0._0_8_;
        uStack_17f8 = local_33c0._8_8_;
        uStack_17f0 = local_33c0._16_8_;
        uStack_17e8 = local_33c0._24_8_;
        uStack_17e0 = local_33c0._32_8_;
        uStack_17d8 = local_33c0._40_8_;
        uStack_17d0 = local_33c0._48_8_;
        uStack_17c8 = local_33c0._56_8_;
        local_33c0 = vfmadd213ps_avx512f(*local_3158,local_22c0,local_33c0);
        local_22c4 = local_3108[8];
        local_2340 = vbroadcastss_avx512f(ZEXT416(local_22c4));
        local_3880 = local_2340._0_8_;
        uStack_3878 = local_2340._8_8_;
        uStack_3870 = local_2340._16_8_;
        uStack_3868 = local_2340._24_8_;
        uStack_3860 = local_2340._32_8_;
        uStack_3858 = local_2340._40_8_;
        uStack_3850 = local_2340._48_8_;
        uStack_3848 = local_2340._56_8_;
        local_2344 = local_3108[9];
        local_23c0 = vbroadcastss_avx512f(ZEXT416(local_2344));
        local_38c0 = local_23c0._0_8_;
        uStack_38b8 = local_23c0._8_8_;
        uStack_38b0 = local_23c0._16_8_;
        uStack_38a8 = local_23c0._24_8_;
        uStack_38a0 = local_23c0._32_8_;
        uStack_3898 = local_23c0._40_8_;
        uStack_3890 = local_23c0._48_8_;
        uStack_3888 = local_23c0._56_8_;
        local_1840 = local_2340._0_8_;
        uStack_1838 = local_2340._8_8_;
        uStack_1830 = local_2340._16_8_;
        uStack_1828 = local_2340._24_8_;
        uStack_1820 = local_2340._32_8_;
        uStack_1818 = local_2340._40_8_;
        uStack_1810 = local_2340._48_8_;
        uStack_1808 = local_2340._56_8_;
        local_18c0 = local_3400._0_8_;
        uStack_18b8 = local_3400._8_8_;
        uStack_18b0 = local_3400._16_8_;
        uStack_18a8 = local_3400._24_8_;
        uStack_18a0 = local_3400._32_8_;
        uStack_1898 = local_3400._40_8_;
        uStack_1890 = local_3400._48_8_;
        uStack_1888 = local_3400._56_8_;
        local_3400 = vfmadd213ps_avx512f(*local_3158,local_2340,local_3400);
        local_1900 = local_23c0._0_8_;
        uStack_18f8 = local_23c0._8_8_;
        uStack_18f0 = local_23c0._16_8_;
        uStack_18e8 = local_23c0._24_8_;
        uStack_18e0 = local_23c0._32_8_;
        uStack_18d8 = local_23c0._40_8_;
        uStack_18d0 = local_23c0._48_8_;
        uStack_18c8 = local_23c0._56_8_;
        local_1980 = local_3440._0_8_;
        uStack_1978 = local_3440._8_8_;
        uStack_1970 = local_3440._16_8_;
        uStack_1968 = local_3440._24_8_;
        uStack_1960 = local_3440._32_8_;
        uStack_1958 = local_3440._40_8_;
        uStack_1950 = local_3440._48_8_;
        uStack_1948 = local_3440._56_8_;
        local_3440 = vfmadd213ps_avx512f(*local_3158,local_23c0,local_3440);
        local_23c4 = local_3108[10];
        local_2440 = vbroadcastss_avx512f(ZEXT416(local_23c4));
        local_3900 = local_2440._0_8_;
        uStack_38f8 = local_2440._8_8_;
        uStack_38f0 = local_2440._16_8_;
        uStack_38e8 = local_2440._24_8_;
        uStack_38e0 = local_2440._32_8_;
        uStack_38d8 = local_2440._40_8_;
        uStack_38d0 = local_2440._48_8_;
        uStack_38c8 = local_2440._56_8_;
        local_2444 = local_3108[0xb];
        local_24c0 = vbroadcastss_avx512f(ZEXT416(local_2444));
        local_3940 = local_24c0._0_8_;
        uStack_3938 = local_24c0._8_8_;
        uStack_3930 = local_24c0._16_8_;
        uStack_3928 = local_24c0._24_8_;
        uStack_3920 = local_24c0._32_8_;
        uStack_3918 = local_24c0._40_8_;
        uStack_3910 = local_24c0._48_8_;
        uStack_3908 = local_24c0._56_8_;
        local_19c0 = local_2440._0_8_;
        uStack_19b8 = local_2440._8_8_;
        uStack_19b0 = local_2440._16_8_;
        uStack_19a8 = local_2440._24_8_;
        uStack_19a0 = local_2440._32_8_;
        uStack_1998 = local_2440._40_8_;
        uStack_1990 = local_2440._48_8_;
        uStack_1988 = local_2440._56_8_;
        local_1a40 = local_3480._0_8_;
        uStack_1a38 = local_3480._8_8_;
        uStack_1a30 = local_3480._16_8_;
        uStack_1a28 = local_3480._24_8_;
        uStack_1a20 = local_3480._32_8_;
        uStack_1a18 = local_3480._40_8_;
        uStack_1a10 = local_3480._48_8_;
        uStack_1a08 = local_3480._56_8_;
        local_3480 = vfmadd213ps_avx512f(*local_3158,local_2440,local_3480);
        local_1a80 = local_24c0._0_8_;
        uStack_1a78 = local_24c0._8_8_;
        uStack_1a70 = local_24c0._16_8_;
        uStack_1a68 = local_24c0._24_8_;
        uStack_1a60 = local_24c0._32_8_;
        uStack_1a58 = local_24c0._40_8_;
        uStack_1a50 = local_24c0._48_8_;
        uStack_1a48 = local_24c0._56_8_;
        local_1b00 = local_34c0._0_8_;
        uStack_1af8 = local_34c0._8_8_;
        uStack_1af0 = local_34c0._16_8_;
        uStack_1ae8 = local_34c0._24_8_;
        uStack_1ae0 = local_34c0._32_8_;
        uStack_1ad8 = local_34c0._40_8_;
        uStack_1ad0 = local_34c0._48_8_;
        uStack_1ac8 = local_34c0._56_8_;
        local_34c0 = vfmadd213ps_avx512f(*local_3158,local_24c0,local_34c0);
        local_24c4 = local_3108[0xc];
        local_2540 = vbroadcastss_avx512f(ZEXT416(local_24c4));
        local_3980 = local_2540._0_8_;
        uStack_3978 = local_2540._8_8_;
        uStack_3970 = local_2540._16_8_;
        uStack_3968 = local_2540._24_8_;
        uStack_3960 = local_2540._32_8_;
        uStack_3958 = local_2540._40_8_;
        uStack_3950 = local_2540._48_8_;
        uStack_3948 = local_2540._56_8_;
        local_2544 = local_3108[0xd];
        local_25c0 = vbroadcastss_avx512f(ZEXT416(local_2544));
        local_39c0 = local_25c0._0_8_;
        uStack_39b8 = local_25c0._8_8_;
        uStack_39b0 = local_25c0._16_8_;
        uStack_39a8 = local_25c0._24_8_;
        uStack_39a0 = local_25c0._32_8_;
        uStack_3998 = local_25c0._40_8_;
        uStack_3990 = local_25c0._48_8_;
        uStack_3988 = local_25c0._56_8_;
        local_1b40 = local_2540._0_8_;
        uStack_1b38 = local_2540._8_8_;
        uStack_1b30 = local_2540._16_8_;
        uStack_1b28 = local_2540._24_8_;
        uStack_1b20 = local_2540._32_8_;
        uStack_1b18 = local_2540._40_8_;
        uStack_1b10 = local_2540._48_8_;
        uStack_1b08 = local_2540._56_8_;
        local_1bc0 = local_3500._0_8_;
        uStack_1bb8 = local_3500._8_8_;
        uStack_1bb0 = local_3500._16_8_;
        uStack_1ba8 = local_3500._24_8_;
        uStack_1ba0 = local_3500._32_8_;
        uStack_1b98 = local_3500._40_8_;
        uStack_1b90 = local_3500._48_8_;
        uStack_1b88 = local_3500._56_8_;
        local_3500 = vfmadd213ps_avx512f(*local_3158,local_2540,local_3500);
        local_1c00 = local_25c0._0_8_;
        uStack_1bf8 = local_25c0._8_8_;
        uStack_1bf0 = local_25c0._16_8_;
        uStack_1be8 = local_25c0._24_8_;
        uStack_1be0 = local_25c0._32_8_;
        uStack_1bd8 = local_25c0._40_8_;
        uStack_1bd0 = local_25c0._48_8_;
        uStack_1bc8 = local_25c0._56_8_;
        local_1c80 = local_3540._0_8_;
        uStack_1c78 = local_3540._8_8_;
        uStack_1c70 = local_3540._16_8_;
        uStack_1c68 = local_3540._24_8_;
        uStack_1c60 = local_3540._32_8_;
        uStack_1c58 = local_3540._40_8_;
        uStack_1c50 = local_3540._48_8_;
        uStack_1c48 = local_3540._56_8_;
        local_3540 = vfmadd213ps_avx512f(*local_3158,local_25c0,local_3540);
        local_25c4 = local_3108[0xe];
        local_2640 = vbroadcastss_avx512f(ZEXT416(local_25c4));
        local_3a00 = local_2640._0_8_;
        uStack_39f8 = local_2640._8_8_;
        uStack_39f0 = local_2640._16_8_;
        uStack_39e8 = local_2640._24_8_;
        uStack_39e0 = local_2640._32_8_;
        uStack_39d8 = local_2640._40_8_;
        uStack_39d0 = local_2640._48_8_;
        uStack_39c8 = local_2640._56_8_;
        local_2644 = local_3108[0xf];
        local_26c0 = vbroadcastss_avx512f(ZEXT416(local_2644));
        local_3a40 = local_26c0._0_8_;
        uStack_3a38 = local_26c0._8_8_;
        uStack_3a30 = local_26c0._16_8_;
        uStack_3a28 = local_26c0._24_8_;
        uStack_3a20 = local_26c0._32_8_;
        uStack_3a18 = local_26c0._40_8_;
        uStack_3a10 = local_26c0._48_8_;
        uStack_3a08 = local_26c0._56_8_;
        local_1cc0 = local_2640._0_8_;
        uStack_1cb8 = local_2640._8_8_;
        uStack_1cb0 = local_2640._16_8_;
        uStack_1ca8 = local_2640._24_8_;
        uStack_1ca0 = local_2640._32_8_;
        uStack_1c98 = local_2640._40_8_;
        uStack_1c90 = local_2640._48_8_;
        uStack_1c88 = local_2640._56_8_;
        local_1d40 = local_3580._0_8_;
        uStack_1d38 = local_3580._8_8_;
        uStack_1d30 = local_3580._16_8_;
        uStack_1d28 = local_3580._24_8_;
        uStack_1d20 = local_3580._32_8_;
        uStack_1d18 = local_3580._40_8_;
        uStack_1d10 = local_3580._48_8_;
        uStack_1d08 = local_3580._56_8_;
        local_3580 = vfmadd213ps_avx512f(*local_3158,local_2640,local_3580);
        local_1d80 = local_26c0._0_8_;
        uStack_1d78 = local_26c0._8_8_;
        uStack_1d70 = local_26c0._16_8_;
        uStack_1d68 = local_26c0._24_8_;
        uStack_1d60 = local_26c0._32_8_;
        uStack_1d58 = local_26c0._40_8_;
        uStack_1d50 = local_26c0._48_8_;
        uStack_1d48 = local_26c0._56_8_;
        local_1e00 = local_35c0._0_8_;
        uStack_1df8 = local_35c0._8_8_;
        uStack_1df0 = local_35c0._16_8_;
        uStack_1de8 = local_35c0._24_8_;
        uStack_1de0 = local_35c0._32_8_;
        uStack_1dd8 = local_35c0._40_8_;
        uStack_1dd0 = local_35c0._48_8_;
        uStack_1dc8 = local_35c0._56_8_;
        local_35c0 = vfmadd213ps_avx512f(*local_3158,local_26c0,local_35c0);
        local_3158 = local_3158 + 1;
        local_3108 = local_3108 + 0x10;
        local_35c4 = local_35c4 + 1;
        local_1dc0 = local_3640;
        uStack_1db8 = uStack_3638;
        uStack_1db0 = uStack_3630;
        uStack_1da8 = uStack_3628;
        uStack_1da0 = uStack_3620;
        uStack_1d98 = uStack_3618;
        uStack_1d90 = uStack_3610;
        uStack_1d88 = uStack_3608;
        local_1d00 = local_3640;
        uStack_1cf8 = uStack_3638;
        uStack_1cf0 = uStack_3630;
        uStack_1ce8 = uStack_3628;
        uStack_1ce0 = uStack_3620;
        uStack_1cd8 = uStack_3618;
        uStack_1cd0 = uStack_3610;
        uStack_1cc8 = uStack_3608;
        local_1c40 = local_3640;
        uStack_1c38 = uStack_3638;
        uStack_1c30 = uStack_3630;
        uStack_1c28 = uStack_3628;
        uStack_1c20 = uStack_3620;
        uStack_1c18 = uStack_3618;
        uStack_1c10 = uStack_3610;
        uStack_1c08 = uStack_3608;
        local_1b80 = local_3640;
        uStack_1b78 = uStack_3638;
        uStack_1b70 = uStack_3630;
        uStack_1b68 = uStack_3628;
        uStack_1b60 = uStack_3620;
        uStack_1b58 = uStack_3618;
        uStack_1b50 = uStack_3610;
        uStack_1b48 = uStack_3608;
        local_1ac0 = local_3640;
        uStack_1ab8 = uStack_3638;
        uStack_1ab0 = uStack_3630;
        uStack_1aa8 = uStack_3628;
        uStack_1aa0 = uStack_3620;
        uStack_1a98 = uStack_3618;
        uStack_1a90 = uStack_3610;
        uStack_1a88 = uStack_3608;
        local_1a00 = local_3640;
        uStack_19f8 = uStack_3638;
        uStack_19f0 = uStack_3630;
        uStack_19e8 = uStack_3628;
        uStack_19e0 = uStack_3620;
        uStack_19d8 = uStack_3618;
        uStack_19d0 = uStack_3610;
        uStack_19c8 = uStack_3608;
        local_1940 = local_3640;
        uStack_1938 = uStack_3638;
        uStack_1930 = uStack_3630;
        uStack_1928 = uStack_3628;
        uStack_1920 = uStack_3620;
        uStack_1918 = uStack_3618;
        uStack_1910 = uStack_3610;
        uStack_1908 = uStack_3608;
        local_1880 = local_3640;
        uStack_1878 = uStack_3638;
        uStack_1870 = uStack_3630;
        uStack_1868 = uStack_3628;
        uStack_1860 = uStack_3620;
        uStack_1858 = uStack_3618;
        uStack_1850 = uStack_3610;
        uStack_1848 = uStack_3608;
        local_17c0 = local_3640;
        uStack_17b8 = uStack_3638;
        uStack_17b0 = uStack_3630;
        uStack_17a8 = uStack_3628;
        uStack_17a0 = uStack_3620;
        uStack_1798 = uStack_3618;
        uStack_1790 = uStack_3610;
        uStack_1788 = uStack_3608;
        local_1700 = local_3640;
        uStack_16f8 = uStack_3638;
        uStack_16f0 = uStack_3630;
        uStack_16e8 = uStack_3628;
        uStack_16e0 = uStack_3620;
        uStack_16d8 = uStack_3618;
        uStack_16d0 = uStack_3610;
        uStack_16c8 = uStack_3608;
        local_1640 = local_3640;
        uStack_1638 = uStack_3638;
        uStack_1630 = uStack_3630;
        uStack_1628 = uStack_3628;
        uStack_1620 = uStack_3620;
        uStack_1618 = uStack_3618;
        uStack_1610 = uStack_3610;
        uStack_1608 = uStack_3608;
        local_1580 = local_3640;
        uStack_1578 = uStack_3638;
        uStack_1570 = uStack_3630;
        uStack_1568 = uStack_3628;
        uStack_1560 = uStack_3620;
        uStack_1558 = uStack_3618;
        uStack_1550 = uStack_3610;
        uStack_1548 = uStack_3608;
        local_14c0 = local_3640;
        uStack_14b8 = uStack_3638;
        uStack_14b0 = uStack_3630;
        uStack_14a8 = uStack_3628;
        uStack_14a0 = uStack_3620;
        uStack_1498 = uStack_3618;
        uStack_1490 = uStack_3610;
        uStack_1488 = uStack_3608;
        local_1400 = local_3640;
        uStack_13f8 = uStack_3638;
        uStack_13f0 = uStack_3630;
        uStack_13e8 = uStack_3628;
        uStack_13e0 = uStack_3620;
        uStack_13d8 = uStack_3618;
        uStack_13d0 = uStack_3610;
        uStack_13c8 = uStack_3608;
        local_1340 = local_3640;
        uStack_1338 = uStack_3638;
        uStack_1330 = uStack_3630;
        uStack_1328 = uStack_3628;
        uStack_1320 = uStack_3620;
        uStack_1318 = uStack_3618;
        uStack_1310 = uStack_3610;
        uStack_1308 = uStack_3608;
        local_1280 = local_3640;
        uStack_1278 = uStack_3638;
        uStack_1270 = uStack_3630;
        uStack_1268 = uStack_3628;
        uStack_1260 = uStack_3620;
        uStack_1258 = uStack_3618;
        uStack_1250 = uStack_3610;
        uStack_1248 = uStack_3608;
      }
      local_980 = local_3060;
      local_9c0 = local_3200._0_8_;
      uStack_9b8 = local_3200._8_8_;
      uStack_9b0 = local_3200._16_8_;
      uStack_9a8 = local_3200._24_8_;
      uStack_9a0 = local_3200._32_8_;
      uStack_998 = local_3200._40_8_;
      uStack_990 = local_3200._48_8_;
      uStack_988 = local_3200._56_8_;
      *local_3060 = local_3200._0_8_;
      local_3060[1] = local_3200._8_8_;
      local_3060[2] = local_3200._16_8_;
      local_3060[3] = local_3200._24_8_;
      local_3060[4] = local_3200._32_8_;
      local_3060[5] = local_3200._40_8_;
      local_3060[6] = local_3200._48_8_;
      local_3060[7] = local_3200._56_8_;
      local_9c8 = local_3060 + 8;
      local_a40 = local_3240._0_8_;
      uStack_a38 = local_3240._8_8_;
      uStack_a30 = local_3240._16_8_;
      uStack_a28 = local_3240._24_8_;
      uStack_a20 = local_3240._32_8_;
      uStack_a18 = local_3240._40_8_;
      uStack_a10 = local_3240._48_8_;
      uStack_a08 = local_3240._56_8_;
      *local_9c8 = local_3240._0_8_;
      local_3060[9] = local_3240._8_8_;
      local_3060[10] = local_3240._16_8_;
      local_3060[0xb] = local_3240._24_8_;
      local_3060[0xc] = local_3240._32_8_;
      local_3060[0xd] = local_3240._40_8_;
      local_3060[0xe] = local_3240._48_8_;
      local_3060[0xf] = local_3240._56_8_;
      local_a48 = local_3060 + 0x10;
      local_ac0 = local_3280._0_8_;
      uStack_ab8 = local_3280._8_8_;
      uStack_ab0 = local_3280._16_8_;
      uStack_aa8 = local_3280._24_8_;
      uStack_aa0 = local_3280._32_8_;
      uStack_a98 = local_3280._40_8_;
      uStack_a90 = local_3280._48_8_;
      uStack_a88 = local_3280._56_8_;
      *local_a48 = local_3280._0_8_;
      local_3060[0x11] = local_3280._8_8_;
      local_3060[0x12] = local_3280._16_8_;
      local_3060[0x13] = local_3280._24_8_;
      local_3060[0x14] = local_3280._32_8_;
      local_3060[0x15] = local_3280._40_8_;
      local_3060[0x16] = local_3280._48_8_;
      local_3060[0x17] = local_3280._56_8_;
      local_ac8 = local_3060 + 0x18;
      local_b40 = local_32c0._0_8_;
      uStack_b38 = local_32c0._8_8_;
      uStack_b30 = local_32c0._16_8_;
      uStack_b28 = local_32c0._24_8_;
      uStack_b20 = local_32c0._32_8_;
      uStack_b18 = local_32c0._40_8_;
      uStack_b10 = local_32c0._48_8_;
      uStack_b08 = local_32c0._56_8_;
      *local_ac8 = local_32c0._0_8_;
      local_3060[0x19] = local_32c0._8_8_;
      local_3060[0x1a] = local_32c0._16_8_;
      local_3060[0x1b] = local_32c0._24_8_;
      local_3060[0x1c] = local_32c0._32_8_;
      local_3060[0x1d] = local_32c0._40_8_;
      local_3060[0x1e] = local_32c0._48_8_;
      local_3060[0x1f] = local_32c0._56_8_;
      local_b48 = local_3060 + 0x20;
      local_bc0 = local_3300._0_8_;
      uStack_bb8 = local_3300._8_8_;
      uStack_bb0 = local_3300._16_8_;
      uStack_ba8 = local_3300._24_8_;
      uStack_ba0 = local_3300._32_8_;
      uStack_b98 = local_3300._40_8_;
      uStack_b90 = local_3300._48_8_;
      uStack_b88 = local_3300._56_8_;
      *local_b48 = local_3300._0_8_;
      local_3060[0x21] = local_3300._8_8_;
      local_3060[0x22] = local_3300._16_8_;
      local_3060[0x23] = local_3300._24_8_;
      local_3060[0x24] = local_3300._32_8_;
      local_3060[0x25] = local_3300._40_8_;
      local_3060[0x26] = local_3300._48_8_;
      local_3060[0x27] = local_3300._56_8_;
      local_bc8 = local_3060 + 0x28;
      local_c40 = local_3340._0_8_;
      uStack_c38 = local_3340._8_8_;
      uStack_c30 = local_3340._16_8_;
      uStack_c28 = local_3340._24_8_;
      uStack_c20 = local_3340._32_8_;
      uStack_c18 = local_3340._40_8_;
      uStack_c10 = local_3340._48_8_;
      uStack_c08 = local_3340._56_8_;
      *local_bc8 = local_3340._0_8_;
      local_3060[0x29] = local_3340._8_8_;
      local_3060[0x2a] = local_3340._16_8_;
      local_3060[0x2b] = local_3340._24_8_;
      local_3060[0x2c] = local_3340._32_8_;
      local_3060[0x2d] = local_3340._40_8_;
      local_3060[0x2e] = local_3340._48_8_;
      local_3060[0x2f] = local_3340._56_8_;
      local_c48 = local_3060 + 0x30;
      local_cc0 = local_3380._0_8_;
      uStack_cb8 = local_3380._8_8_;
      uStack_cb0 = local_3380._16_8_;
      uStack_ca8 = local_3380._24_8_;
      uStack_ca0 = local_3380._32_8_;
      uStack_c98 = local_3380._40_8_;
      uStack_c90 = local_3380._48_8_;
      uStack_c88 = local_3380._56_8_;
      *local_c48 = local_3380._0_8_;
      local_3060[0x31] = local_3380._8_8_;
      local_3060[0x32] = local_3380._16_8_;
      local_3060[0x33] = local_3380._24_8_;
      local_3060[0x34] = local_3380._32_8_;
      local_3060[0x35] = local_3380._40_8_;
      local_3060[0x36] = local_3380._48_8_;
      local_3060[0x37] = local_3380._56_8_;
      local_cc8 = local_3060 + 0x38;
      local_d40 = local_33c0._0_8_;
      uStack_d38 = local_33c0._8_8_;
      uStack_d30 = local_33c0._16_8_;
      uStack_d28 = local_33c0._24_8_;
      uStack_d20 = local_33c0._32_8_;
      uStack_d18 = local_33c0._40_8_;
      uStack_d10 = local_33c0._48_8_;
      uStack_d08 = local_33c0._56_8_;
      *local_cc8 = local_33c0._0_8_;
      local_3060[0x39] = local_33c0._8_8_;
      local_3060[0x3a] = local_33c0._16_8_;
      local_3060[0x3b] = local_33c0._24_8_;
      local_3060[0x3c] = local_33c0._32_8_;
      local_3060[0x3d] = local_33c0._40_8_;
      local_3060[0x3e] = local_33c0._48_8_;
      local_3060[0x3f] = local_33c0._56_8_;
      local_d48 = local_3060 + 0x40;
      local_dc0 = local_3400._0_8_;
      uStack_db8 = local_3400._8_8_;
      uStack_db0 = local_3400._16_8_;
      uStack_da8 = local_3400._24_8_;
      uStack_da0 = local_3400._32_8_;
      uStack_d98 = local_3400._40_8_;
      uStack_d90 = local_3400._48_8_;
      uStack_d88 = local_3400._56_8_;
      *local_d48 = local_3400._0_8_;
      local_3060[0x41] = local_3400._8_8_;
      local_3060[0x42] = local_3400._16_8_;
      local_3060[0x43] = local_3400._24_8_;
      local_3060[0x44] = local_3400._32_8_;
      local_3060[0x45] = local_3400._40_8_;
      local_3060[0x46] = local_3400._48_8_;
      local_3060[0x47] = local_3400._56_8_;
      local_dc8 = local_3060 + 0x48;
      local_e40 = local_3440._0_8_;
      uStack_e38 = local_3440._8_8_;
      uStack_e30 = local_3440._16_8_;
      uStack_e28 = local_3440._24_8_;
      uStack_e20 = local_3440._32_8_;
      uStack_e18 = local_3440._40_8_;
      uStack_e10 = local_3440._48_8_;
      uStack_e08 = local_3440._56_8_;
      *local_dc8 = local_3440._0_8_;
      local_3060[0x49] = local_3440._8_8_;
      local_3060[0x4a] = local_3440._16_8_;
      local_3060[0x4b] = local_3440._24_8_;
      local_3060[0x4c] = local_3440._32_8_;
      local_3060[0x4d] = local_3440._40_8_;
      local_3060[0x4e] = local_3440._48_8_;
      local_3060[0x4f] = local_3440._56_8_;
      local_e48 = local_3060 + 0x50;
      local_ec0 = local_3480._0_8_;
      uStack_eb8 = local_3480._8_8_;
      uStack_eb0 = local_3480._16_8_;
      uStack_ea8 = local_3480._24_8_;
      uStack_ea0 = local_3480._32_8_;
      uStack_e98 = local_3480._40_8_;
      uStack_e90 = local_3480._48_8_;
      uStack_e88 = local_3480._56_8_;
      *local_e48 = local_3480._0_8_;
      local_3060[0x51] = local_3480._8_8_;
      local_3060[0x52] = local_3480._16_8_;
      local_3060[0x53] = local_3480._24_8_;
      local_3060[0x54] = local_3480._32_8_;
      local_3060[0x55] = local_3480._40_8_;
      local_3060[0x56] = local_3480._48_8_;
      local_3060[0x57] = local_3480._56_8_;
      local_ec8 = local_3060 + 0x58;
      local_f40 = local_34c0._0_8_;
      uStack_f38 = local_34c0._8_8_;
      uStack_f30 = local_34c0._16_8_;
      uStack_f28 = local_34c0._24_8_;
      uStack_f20 = local_34c0._32_8_;
      uStack_f18 = local_34c0._40_8_;
      uStack_f10 = local_34c0._48_8_;
      uStack_f08 = local_34c0._56_8_;
      *local_ec8 = local_34c0._0_8_;
      local_3060[0x59] = local_34c0._8_8_;
      local_3060[0x5a] = local_34c0._16_8_;
      local_3060[0x5b] = local_34c0._24_8_;
      local_3060[0x5c] = local_34c0._32_8_;
      local_3060[0x5d] = local_34c0._40_8_;
      local_3060[0x5e] = local_34c0._48_8_;
      local_3060[0x5f] = local_34c0._56_8_;
      local_f48 = local_3060 + 0x60;
      local_fc0 = local_3500._0_8_;
      uStack_fb8 = local_3500._8_8_;
      uStack_fb0 = local_3500._16_8_;
      uStack_fa8 = local_3500._24_8_;
      uStack_fa0 = local_3500._32_8_;
      uStack_f98 = local_3500._40_8_;
      uStack_f90 = local_3500._48_8_;
      uStack_f88 = local_3500._56_8_;
      *local_f48 = local_3500._0_8_;
      local_3060[0x61] = local_3500._8_8_;
      local_3060[0x62] = local_3500._16_8_;
      local_3060[99] = local_3500._24_8_;
      local_3060[100] = local_3500._32_8_;
      local_3060[0x65] = local_3500._40_8_;
      local_3060[0x66] = local_3500._48_8_;
      local_3060[0x67] = local_3500._56_8_;
      local_fc8 = local_3060 + 0x68;
      local_1040 = local_3540._0_8_;
      uStack_1038 = local_3540._8_8_;
      uStack_1030 = local_3540._16_8_;
      uStack_1028 = local_3540._24_8_;
      uStack_1020 = local_3540._32_8_;
      uStack_1018 = local_3540._40_8_;
      uStack_1010 = local_3540._48_8_;
      uStack_1008 = local_3540._56_8_;
      *local_fc8 = local_3540._0_8_;
      local_3060[0x69] = local_3540._8_8_;
      local_3060[0x6a] = local_3540._16_8_;
      local_3060[0x6b] = local_3540._24_8_;
      local_3060[0x6c] = local_3540._32_8_;
      local_3060[0x6d] = local_3540._40_8_;
      local_3060[0x6e] = local_3540._48_8_;
      local_3060[0x6f] = local_3540._56_8_;
      local_1048 = local_3060 + 0x70;
      local_10c0 = local_3580._0_8_;
      uStack_10b8 = local_3580._8_8_;
      uStack_10b0 = local_3580._16_8_;
      uStack_10a8 = local_3580._24_8_;
      uStack_10a0 = local_3580._32_8_;
      uStack_1098 = local_3580._40_8_;
      uStack_1090 = local_3580._48_8_;
      uStack_1088 = local_3580._56_8_;
      *local_1048 = local_3580._0_8_;
      local_3060[0x71] = local_3580._8_8_;
      local_3060[0x72] = local_3580._16_8_;
      local_3060[0x73] = local_3580._24_8_;
      local_3060[0x74] = local_3580._32_8_;
      local_3060[0x75] = local_3580._40_8_;
      local_3060[0x76] = local_3580._48_8_;
      local_3060[0x77] = local_3580._56_8_;
      local_10c8 = local_3060 + 0x78;
      local_1140 = local_35c0._0_8_;
      uStack_1138 = local_35c0._8_8_;
      uStack_1130 = local_35c0._16_8_;
      uStack_1128 = local_35c0._24_8_;
      uStack_1120 = local_35c0._32_8_;
      uStack_1118 = local_35c0._40_8_;
      uStack_1110 = local_35c0._48_8_;
      uStack_1108 = local_35c0._56_8_;
      *local_10c8 = local_35c0._0_8_;
      local_3060[0x79] = local_35c0._8_8_;
      local_3060[0x7a] = local_35c0._16_8_;
      local_3060[0x7b] = local_35c0._24_8_;
      local_3060[0x7c] = local_35c0._32_8_;
      local_3060[0x7d] = local_35c0._40_8_;
      local_3060[0x7e] = local_35c0._48_8_;
      local_3060[0x7f] = local_35c0._56_8_;
      local_3060 = local_3060 + 0x80;
      local_2b00 = local_2bb8;
      local_2ae0 = local_2bc8;
      local_3180 = local_268;
    }
    for (; local_30fc < local_2c4c; local_30fc = local_30fc + 1) {
      local_2a34 = local_30fc / 0x10 + local_30fc % 0x10;
      local_2a28 = &local_3a90;
      local_2a30 = &local_2ca8;
      local_100 = (uint *)((long)local_2ca8 + local_2c68 * local_2a34 * local_2c98);
      local_e8 = &local_3a90;
      local_d8 = (long)local_2c7c * (long)local_2c78 * local_2c98;
      local_2948 = &local_3a90;
      local_2ba8 = &local_3a90;
      local_28e8 = &local_3ae0;
      local_204 = *(int *)((long)local_2c38 + 0x2c);
      local_208 = (int)local_2c38[6];
      local_20c = *(undefined4 *)((long)local_2c38 + 0x34);
      local_218 = (undefined1 (*) [64])
                  (*local_2c38 + local_2c38[8] * (long)local_3054 * local_2c38[2]);
      local_220 = local_2c38[2];
      local_224 = (undefined4)local_2c38[3];
      local_230 = local_2c38[4];
      local_200 = &local_3ae0;
      local_88 = (long)local_204 * (long)local_208 * local_220;
      local_3a58 = 0;
      local_3a5c = 0;
      local_3a60 = 0;
      local_3a64 = 0;
      local_3a70 = local_2c88;
      local_3a78 = 0;
      local_3a80 = 0;
      local_3a88 = 0;
      local_3a90 = 0;
      local_8c = 0x10;
      local_dc = 0x10;
      local_ec = local_2c7c;
      local_f0 = local_2c78;
      local_f4 = local_2c74;
      local_108 = local_2c98;
      local_10c = local_2c90;
      local_118 = local_2c88;
      local_28f4 = local_3054;
      local_28f5 = 1;
      local_2a35 = 1;
      local_3a50 = 0;
      local_3a68 = 0;
      local_2920 = &local_3ae0;
      local_2b98 = &local_3ae0;
      local_3ae0 = 0;
      local_3ad0 = 0;
      local_3ac8 = 0;
      local_3ab8 = 0;
      local_3ab4 = 0;
      local_3ab0 = 0;
      local_3aac = 0;
      local_3aa8 = 0;
      local_3aa0 = 0;
      local_3ad8 = 0;
      local_2750 = local_4000;
      local_3b40 = *local_4000;
      local_3b44 = 0;
      local_3a98 = local_218;
      local_3a48 = local_100;
      while( true ) {
        if (local_2c54 * local_2c50 * 4 <= local_3b44) break;
        local_11d0 = local_3a98;
        local_1e80 = *(undefined8 *)*local_3a98;
        uStack_1e78 = *(undefined8 *)(*local_3a98 + 8);
        uStack_1e70 = *(undefined8 *)(*local_3a98 + 0x10);
        uStack_1e68 = *(undefined8 *)(*local_3a98 + 0x18);
        uStack_1e60 = *(undefined8 *)(*local_3a98 + 0x20);
        uStack_1e58 = *(undefined8 *)(*local_3a98 + 0x28);
        uStack_1e50 = *(undefined8 *)(*local_3a98 + 0x30);
        uStack_1e48 = *(undefined8 *)(*local_3a98 + 0x38);
        local_26c4 = *local_3a48;
        local_2740 = vbroadcastss_avx512f(ZEXT416(local_26c4));
        local_1e40 = local_2740._0_8_;
        uStack_1e38 = local_2740._8_8_;
        uStack_1e30 = local_2740._16_8_;
        uStack_1e28 = local_2740._24_8_;
        uStack_1e20 = local_2740._32_8_;
        uStack_1e18 = local_2740._40_8_;
        uStack_1e10 = local_2740._48_8_;
        uStack_1e08 = local_2740._56_8_;
        local_1ec0 = local_3b40._0_8_;
        uStack_1eb8 = local_3b40._8_8_;
        uStack_1eb0 = local_3b40._16_8_;
        uStack_1ea8 = local_3b40._24_8_;
        uStack_1ea0 = local_3b40._32_8_;
        uStack_1e98 = local_3b40._40_8_;
        uStack_1e90 = local_3b40._48_8_;
        uStack_1e88 = local_3b40._56_8_;
        local_3b40 = vfmadd213ps_avx512f(*local_3a98,local_2740,local_3b40);
        local_3a98 = local_3a98 + 1;
        local_3a48 = local_3a48 + 1;
        local_3b44 = local_3b44 + 1;
      }
      local_1148 = local_3060;
      local_11c0 = local_3b40._0_8_;
      uStack_11b8 = local_3b40._8_8_;
      uStack_11b0 = local_3b40._16_8_;
      uStack_11a8 = local_3b40._24_8_;
      uStack_11a0 = local_3b40._32_8_;
      uStack_1198 = local_3b40._40_8_;
      uStack_1190 = local_3b40._48_8_;
      uStack_1188 = local_3b40._56_8_;
      *local_3060 = local_3b40._0_8_;
      local_3060[1] = local_3b40._8_8_;
      local_3060[2] = local_3b40._16_8_;
      local_3060[3] = local_3b40._24_8_;
      local_3060[4] = local_3b40._32_8_;
      local_3060[5] = local_3b40._40_8_;
      local_3060[6] = local_3b40._48_8_;
      local_3060[7] = local_3b40._56_8_;
      local_3060 = local_3060 + 8;
      local_2b40 = local_2b98;
      local_2b20 = local_2ba8;
      local_3ac0 = local_230;
    }
  }
  local_2b88 = &local_2ca8;
  if (local_2ca0 != (int *)0x0) {
    local_2b64 = 0xffffffff;
    LOCK();
    local_2b68 = *local_2ca0;
    *local_2ca0 = *local_2ca0 + -1;
    UNLOCK();
    if (local_2b68 == 1) {
      local_2b60 = local_2b88;
      if (local_2c88 == (long *)0x0) {
        local_2760 = local_2ca8;
        if (local_2ca8 != (void *)0x0) {
          free(local_2ca8);
        }
      }
      else {
        (**(code **)(*local_2c88 + 0x18))(local_2c88,local_2ca8);
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4to16_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 16u, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 16)
        tmp.create(16 * maxk, inch, size / 16 + size % 16, 16u, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 16u, 4, opt.workspace_allocator);
    {
        int nn_size = size >> 4;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 16;

            float* tmpptr = tmp.channel(i / 16);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x16
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);
                    __m128 _r8 = _mm_load_ps(img0 + 4 * 8);
                    __m128 _r9 = _mm_load_ps(img0 + 4 * 9);
                    __m128 _ra = _mm_load_ps(img0 + 4 * 10);
                    __m128 _rb = _mm_load_ps(img0 + 4 * 11);
                    __m128 _rc = _mm_load_ps(img0 + 4 * 12);
                    __m128 _rd = _mm_load_ps(img0 + 4 * 13);
                    __m128 _re = _mm_load_ps(img0 + 4 * 14);
                    __m128 _rf = _mm_load_ps(img0 + 4 * 15);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                    _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r8);
                    _mm_store_ps(tmpptr + 4 * 3, _rc);
                    _mm_store_ps(tmpptr + 4 * 4, _r1);
                    _mm_store_ps(tmpptr + 4 * 5, _r5);
                    _mm_store_ps(tmpptr + 4 * 6, _r9);
                    _mm_store_ps(tmpptr + 4 * 7, _rd);
                    _mm_store_ps(tmpptr + 4 * 8, _r2);
                    _mm_store_ps(tmpptr + 4 * 9, _r6);
                    _mm_store_ps(tmpptr + 4 * 10, _ra);
                    _mm_store_ps(tmpptr + 4 * 11, _re);
                    _mm_store_ps(tmpptr + 4 * 12, _r3);
                    _mm_store_ps(tmpptr + 4 * 13, _r7);
                    _mm_store_ps(tmpptr + 4 * 14, _rb);
                    _mm_store_ps(tmpptr + 4 * 15, _rf);

                    img0 += size * 4;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 16 + i % 16);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 16 : zeros;

        int i = 0;
        for (; i + 15 < size; i += 16)
        {
            float* tmpptr = tmp.channel(i / 16);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;
            __m512 _sum8 = _sum0;
            __m512 _sum9 = _sum0;
            __m512 _suma = _sum0;
            __m512 _sumb = _sum0;
            __m512 _sumc = _sum0;
            __m512 _sumd = _sum0;
            __m512 _sume = _sum0;
            __m512 _sumf = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);
                __m512 _val8 = _mm512_set1_ps(tmpptr[8]);
                __m512 _val9 = _mm512_set1_ps(tmpptr[9]);
                _sum8 = _mm512_fmadd_ps(_val8, _w0, _sum8);
                _sum9 = _mm512_fmadd_ps(_val9, _w0, _sum9);
                __m512 _vala = _mm512_set1_ps(tmpptr[10]);
                __m512 _valb = _mm512_set1_ps(tmpptr[11]);
                _suma = _mm512_fmadd_ps(_vala, _w0, _suma);
                _sumb = _mm512_fmadd_ps(_valb, _w0, _sumb);
                __m512 _valc = _mm512_set1_ps(tmpptr[12]);
                __m512 _vald = _mm512_set1_ps(tmpptr[13]);
                _sumc = _mm512_fmadd_ps(_valc, _w0, _sumc);
                _sumd = _mm512_fmadd_ps(_vald, _w0, _sumd);
                __m512 _vale = _mm512_set1_ps(tmpptr[14]);
                __m512 _valf = _mm512_set1_ps(tmpptr[15]);
                _sume = _mm512_fmadd_ps(_vale, _w0, _sume);
                _sumf = _mm512_fmadd_ps(_valf, _w0, _sumf);

                kptr += 16;
                tmpptr += 16;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 16 * 2, _sum2);
            _mm512_store_ps(outptr0 + 16 * 3, _sum3);
            _mm512_store_ps(outptr0 + 16 * 4, _sum4);
            _mm512_store_ps(outptr0 + 16 * 5, _sum5);
            _mm512_store_ps(outptr0 + 16 * 6, _sum6);
            _mm512_store_ps(outptr0 + 16 * 7, _sum7);
            _mm512_store_ps(outptr0 + 16 * 8, _sum8);
            _mm512_store_ps(outptr0 + 16 * 9, _sum9);
            _mm512_store_ps(outptr0 + 16 * 10, _suma);
            _mm512_store_ps(outptr0 + 16 * 11, _sumb);
            _mm512_store_ps(outptr0 + 16 * 12, _sumc);
            _mm512_store_ps(outptr0 + 16 * 13, _sumd);
            _mm512_store_ps(outptr0 + 16 * 14, _sume);
            _mm512_store_ps(outptr0 + 16 * 15, _sumf);

            outptr0 += 16 * 16;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 16 + i % 16);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);
                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);

                kptr += 16;
                tmpptr += 1;
            }

            _mm512_store_ps(outptr0, _sum0);
            outptr0 += 16;
        }
    }
}